

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O0

void swrenderer::R_DrawRemainingPlayerSprites(void)

{
  float fVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  vissprite_t *pvVar6;
  FDynamicColormap *pFVar7;
  lighttable_t *plVar8;
  FTexture *img;
  int iVar9;
  DFrameBuffer *this;
  uint uVar10;
  uint32 uVar11;
  uint32 uVar12;
  int iVar13;
  int iVar14;
  vispsp_t *pvVar15;
  FSpecialColormap *pFVar16;
  FRemapTable *pFVar17;
  bool bVar18;
  double dVar19;
  long local_128;
  PalEntry local_7c;
  ulong local_78;
  ptrdiff_t specialmap;
  anon_union_4_2_12391d7c_for_PalEntry_0 aStack_68;
  bool usecolormapstyle;
  FColormapStyle colormapstyle;
  PalEntry overlay;
  FSpecialColormap *special;
  bool flip;
  FDynamicColormap *colormap;
  vissprite_t *vis;
  uint i;
  
  vis._4_4_ = 0;
  do {
    if (vispspindex <= vis._4_4_) {
      vispspindex = 0;
      return;
    }
    pvVar15 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::operator[]
                        ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                         (ulong)vis._4_4_);
    pvVar6 = pvVar15->vis;
    pvVar15 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::operator[]
                        ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                         (ulong)vis._4_4_);
    pFVar7 = pvVar15->basecolormap;
    iVar4 = (pvVar6->field_14).field_0.xiscale;
    stack0xffffffffffffffa8 = (FSpecialColormap *)0x0;
    PalEntry::PalEntry((PalEntry *)&colormapstyle.Desaturate,0);
    FColormapStyle::FColormapStyle((FColormapStyle *)((long)&specialmap + 4));
    specialmap._3_1_ = 0;
    plVar8 = (pvVar6->Style).colormap;
    pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,0);
    if (plVar8 < pFVar16->Colormap) {
LAB_0038e299:
      uVar11 = PalEntry::operator_cast_to_unsigned_int(&pFVar7->Color);
      PalEntry::PalEntry(&local_7c,0xff,0xff,0xff);
      uVar12 = PalEntry::operator_cast_to_unsigned_int(&local_7c);
      bVar18 = false;
      if (uVar11 == uVar12) {
        bVar18 = pFVar7->Desaturate == 0;
      }
      if (bVar18) {
        colormapstyle.Desaturate =
             CONCAT13((char)((((long)(pvVar6->Style).colormap - (long)pFVar7->Maps >> 8) * 0xff) /
                            0x20),(int3)(pFVar7->Fade).field_0.d);
      }
      else {
        specialmap._3_1_ = 1;
        specialmap._4_4_ = (pFVar7->Color).field_0;
        aStack_68 = (pFVar7->Fade).field_0;
        colormapstyle.Color.field_0 = (anon_union_4_2_12391d7c_for_PalEntry_0)pFVar7->Desaturate;
        colormapstyle.Fade.field_0 =
             (anon_union_4_2_12391d7c_for_PalEntry_0)
             ((float)((long)(pvVar6->Style).colormap - (long)pFVar7->Maps >> 8) / 32.0);
      }
    }
    else {
      plVar8 = (pvVar6->Style).colormap;
      uVar10 = TArray<FSpecialColormap,_FSpecialColormap>::Size(&SpecialColormaps);
      pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::operator[]
                          (&SpecialColormaps,(ulong)uVar10);
      if (pFVar16->Colormap <= plVar8) goto LAB_0038e299;
      plVar8 = (pvVar6->Style).colormap;
      pFVar16 = TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,0);
      local_78 = (ulong)((long)plVar8 - (long)pFVar16->Colormap) / 0x518;
      register0x00000000 =
           TArray<FSpecialColormap,_FSpecialColormap>::operator[](&SpecialColormaps,local_78);
    }
    this = screen;
    iVar9 = viewwindowx;
    img = (pvVar6->field_13).pic;
    pvVar15 = TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t>::operator[]
                        ((TArray<swrenderer::vispsp_t,_swrenderer::vispsp_t> *)vispsprites,
                         (ulong)vis._4_4_);
    iVar5 = pvVar15->x1;
    iVar13 = viewwindowy + viewheight / 2;
    dVar3 = (pvVar6->field_14).field_0.texturemid;
    fVar1 = pvVar6->yscale;
    iVar14 = FTexture::GetWidth((pvVar6->field_13).pic);
    dVar19 = FixedToFloat(iVar14 * pvVar6->xscale);
    iVar14 = FTexture::GetHeight((pvVar6->field_13).pic);
    fVar2 = pvVar6->yscale;
    pFVar17 = TranslationToTable(pvVar6->Translation);
    if ((specialmap._3_1_ & 1) == 0) {
      local_128 = 0;
    }
    else {
      local_128 = (long)&specialmap + 4;
    }
    DCanvas::DrawTexture
              ((DCanvas *)this,img,(double)(iVar9 + iVar5),
               ((double)iVar13 - dVar3 * (double)fVar1) - 0.5,0x400013af,dVar19,
               (double)((float)iVar14 * fVar2),(double)(pvVar6->Style).Alpha,0x400013b0,0x4000138e,
               pFVar17,0x40001395,(uint)(iVar4 < 0),0x4000139b,0,0x4000139c,0,0x400013a3,viewwindowx
               ,0x400013a1,viewwindowy,0x400013a4,viewwindowx + viewwidth,0x400013a2,
               viewwindowy + viewheight,0x4000138c,0x400013a9,(pvVar6->Style).RenderStyle.AsDWORD,
               0x4000138d,pvVar6->FillColor,0x400013ac,stack0xffffffffffffffa8,0x400013aa,
               colormapstyle.Desaturate,0x400013ad,local_128,0);
    vis._4_4_ = vis._4_4_ + 1;
  } while( true );
}

Assistant:

void R_DrawRemainingPlayerSprites()
{
	for (unsigned int i = 0; i < vispspindex; i++)
	{
		vissprite_t *vis;
		
		vis = vispsprites[i].vis;
		FDynamicColormap *colormap = vispsprites[i].basecolormap;
		bool flip = vis->xiscale < 0;
		FSpecialColormap *special = NULL;
		PalEntry overlay = 0;
		FColormapStyle colormapstyle;
		bool usecolormapstyle = false;

		if (vis->Style.colormap >= SpecialColormaps[0].Colormap && 
			vis->Style.colormap < SpecialColormaps[SpecialColormaps.Size()].Colormap)
		{
			// Yuck! There needs to be a better way to store colormaps in the vissprite... :(
			ptrdiff_t specialmap = (vis->Style.colormap - SpecialColormaps[0].Colormap) / sizeof(FSpecialColormap);
			special = &SpecialColormaps[specialmap];
		}
		else if (colormap->Color == PalEntry(255,255,255) &&
			colormap->Desaturate == 0)
		{
			overlay = colormap->Fade;
			overlay.a = BYTE(((vis->Style.colormap - colormap->Maps) >> 8) * 255 / NUMCOLORMAPS);
		}
		else
		{
			usecolormapstyle = true;
			colormapstyle.Color = colormap->Color;
			colormapstyle.Fade = colormap->Fade;
			colormapstyle.Desaturate = colormap->Desaturate;
			colormapstyle.FadeLevel = ((vis->Style.colormap - colormap->Maps) >> 8) / float(NUMCOLORMAPS);
		}
		screen->DrawTexture(vis->pic,
			viewwindowx + vispsprites[i].x1,
			viewwindowy + viewheight/2 - vis->texturemid * vis->yscale - 0.5,
			DTA_DestWidthF, FIXED2DBL(vis->pic->GetWidth() * vis->xscale),
			DTA_DestHeightF, vis->pic->GetHeight() * vis->yscale,
			DTA_Translation, TranslationToTable(vis->Translation),
			DTA_FlipX, flip,
			DTA_TopOffset, 0,
			DTA_LeftOffset, 0,
			DTA_ClipLeft, viewwindowx,
			DTA_ClipTop, viewwindowy,
			DTA_ClipRight, viewwindowx + viewwidth,
			DTA_ClipBottom, viewwindowy + viewheight,
			DTA_AlphaF, vis->Style.Alpha,
			DTA_RenderStyle, vis->Style.RenderStyle,
			DTA_FillColor, vis->FillColor,
			DTA_SpecialColormap, special,
			DTA_ColorOverlay, overlay.d,
			DTA_ColormapStyle, usecolormapstyle ? &colormapstyle : NULL,
			TAG_DONE);
	}

	vispspindex = 0;
}